

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O2

int num_length(uint number)

{
  uint count;
  int iVar1;
  
  if (number == 0) {
    iVar1 = 2;
  }
  else {
    iVar1 = 1;
    for (; number != 0; number = number / 10) {
      iVar1 = iVar1 + 1;
    }
  }
  return iVar1;
}

Assistant:

int
num_length(unsigned number)
{
  if (number) {
    unsigned count = 1;
    while (number > 0) {
      number /= 10;
      ++count;
    }
    return count;
  } else
    return 2;
}